

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O3

void __thiscall axl::io::ShmtBase::disconnect(ShmtBase *this)

{
  int32_t *piVar1;
  ShmtFileHdr *pSVar2;
  __sighandler_t in_RDX;
  __sighandler_t extraout_RDX;
  __sighandler_t extraout_RDX_00;
  bool bVar3;
  
  pSVar2 = this->m_hdr;
  while( true ) {
    piVar1 = &pSVar2->m_lock;
    LOCK();
    bVar3 = *piVar1 == 0;
    if (bVar3) {
      *piVar1 = 1;
    }
    UNLOCK();
    if (bVar3) break;
    sched_yield();
    in_RDX = extraout_RDX;
  }
  pSVar2 = this->m_hdr;
  pSVar2->m_state = pSVar2->m_state | 4;
  if (pSVar2->m_readSemaphoreWaitCount != 0) {
    sys::NamedSemaphore::signal(&this->m_readSemaphore,pSVar2->m_readSemaphoreWaitCount,in_RDX);
    pSVar2 = this->m_hdr;
    pSVar2->m_readSemaphoreWaitCount = 0;
    in_RDX = extraout_RDX_00;
  }
  if (pSVar2->m_writeSemaphoreWaitCount != 0) {
    sys::NamedSemaphore::signal(&this->m_writeSemaphore,pSVar2->m_writeSemaphoreWaitCount,in_RDX);
    pSVar2 = this->m_hdr;
    pSVar2->m_writeSemaphoreWaitCount = 0;
  }
  LOCK();
  if (pSVar2->m_lock == 1) {
    pSVar2->m_lock = 0;
  }
  UNLOCK();
  return;
}

Assistant:

void
ShmtBase::disconnect() {
	sys::atomicLock(&m_hdr->m_lock);

	m_hdr->m_state |= ShmtState_Disconnected;

	if (m_hdr->m_readSemaphoreWaitCount) {
		m_readSemaphore.signal(m_hdr->m_readSemaphoreWaitCount);
		m_hdr->m_readSemaphoreWaitCount = 0;
	}

	if (m_hdr->m_writeSemaphoreWaitCount) {
		m_writeSemaphore.signal(m_hdr->m_writeSemaphoreWaitCount);
		m_hdr->m_writeSemaphoreWaitCount = 0;
	}

	sys::atomicUnlock(&m_hdr->m_lock);
}